

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_calc_binningde(fitsfile *fptr,int naxis,char (*colname) [71],char **colexpr,double *minin,
                       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
                       char (*binname) [71],int *colnum,int *datatypes,long *haxes,double *amin,
                       double *amax,double *binsize,long *repeat,int *status)

{
  double *pdVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long in_RCX;
  char *in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  double dVar5;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  long *in_stack_00000058;
  long *in_stack_00000060;
  ParseData lParse;
  int naxis_1;
  long naxes [5];
  long nelem;
  int ncols;
  double datamax;
  double datamin;
  long repeat1;
  int use_datamax;
  int ibin;
  int imax;
  int imin;
  int datatype;
  int ii;
  int tstatus;
  char keyname [75];
  char errmsg [81];
  char cpref [4] [71];
  char *cptr;
  tcolumn *colptr;
  int *in_stack_00001ba8;
  double *in_stack_00001bb0;
  double *in_stack_00001bb8;
  int in_stack_00001bc4;
  fitsfile *in_stack_00001bc8;
  ParseData *lParse_00;
  int *in_stack_fffffffffffffc18;
  long *in_stack_fffffffffffffc20;
  long *in_stack_fffffffffffffc28;
  int *in_stack_fffffffffffffc30;
  char *pcVar6;
  char *in_stack_fffffffffffffc38;
  fitsfile *in_stack_fffffffffffffc40;
  fitsfile *in_stack_fffffffffffffc48;
  int *in_stack_fffffffffffffc50;
  int *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined5 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc75;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  int *in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc84;
  fitsfile *in_stack_fffffffffffffc88;
  long *in_stack_fffffffffffffc90;
  int *in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca4;
  char *in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcb4;
  fitsfile *in_stack_fffffffffffffcb8;
  int *in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  ParseData *in_stack_fffffffffffffce0;
  int *in_stack_fffffffffffffce8;
  undefined1 local_298 [84];
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  char local_1d8 [96];
  char local_178 [64];
  undefined7 in_stack_fffffffffffffec8;
  char cVar7;
  int *in_stack_fffffffffffffed0;
  double *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  fitsfile *in_stack_fffffffffffffef0;
  char local_ea [71];
  char local_a3 [83];
  char *local_50;
  long local_40;
  long local_38;
  long local_30;
  char *local_28;
  int local_1c;
  int local_c;
  
  local_244 = 0;
  if ((int)*in_stack_00000060 < 1) {
    if (in_stack_00000058 != (long *)0x0) {
      *in_stack_00000058 = 0;
    }
    if (in_ESI < 5) {
      local_40 = in_R9;
      local_38 = in_R8;
      local_30 = in_RCX;
      local_28 = in_RDX;
      local_1c = in_ESI;
      if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        ffmahd(in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,in_stack_fffffffffffffc78,
               (int *)CONCAT17(in_stack_fffffffffffffc77,
                               CONCAT16(in_stack_fffffffffffffc76,
                                        CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70
                                                ))));
      }
      local_178[0] = '\0';
      cVar7 = '\0';
      local_ea[0] = '\0';
      local_a3[0] = '\0';
      local_22c = 0;
      ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
            in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
            (int *)in_stack_fffffffffffffc20);
      if (local_22c == 0) {
        local_50 = local_178;
        while( true ) {
          in_stack_fffffffffffffc77 = false;
          if (*local_50 != ',') {
            in_stack_fffffffffffffc77 = *local_50 != '\0';
          }
          if ((bool)in_stack_fffffffffffffc77 == false) break;
          local_50 = local_50 + 1;
        }
        if (*local_50 != '\0') {
          *local_50 = '\0';
          do {
            local_50 = local_50 + 1;
          } while (*local_50 == ' ');
          strcpy(&stack0xfffffffffffffecf,local_50);
          local_50 = &stack0xfffffffffffffecf;
          while( true ) {
            in_stack_fffffffffffffc76 = false;
            if (*local_50 != ',') {
              in_stack_fffffffffffffc76 = *local_50 != '\0';
            }
            if ((bool)in_stack_fffffffffffffc76 == false) break;
            local_50 = local_50 + 1;
          }
          if (*local_50 != '\0') {
            *local_50 = '\0';
            do {
              local_50 = local_50 + 1;
            } while (*local_50 == ' ');
            strcpy(local_ea,local_50);
            local_50 = local_ea;
            while( true ) {
              in_stack_fffffffffffffc75 = false;
              if (*local_50 != ',') {
                in_stack_fffffffffffffc75 = *local_50 != '\0';
              }
              if ((bool)in_stack_fffffffffffffc75 == false) break;
              local_50 = local_50 + 1;
            }
            if (*local_50 != '\0') {
              *local_50 = '\0';
              do {
                local_50 = local_50 + 1;
              } while (*local_50 == ' ');
              strcpy(local_a3,local_50);
            }
          }
        }
      }
      for (local_230 = 0; local_230 < local_1c; local_230 = local_230 + 1) {
        if (((local_28[(long)local_230 * 0x47] == '\0') &&
            (((local_30 == 0 || (*(long *)(local_30 + (long)local_230 * 8) == 0)) ||
             (**(char **)(local_30 + (long)local_230 * 8) == '\0')))) &&
           (strcpy(local_28 + (long)local_230 * 0x47,local_178 + (long)local_230 * 0x47),
           local_28[(long)local_230 * 0x47] == '\0')) {
          if (local_230 == 0) {
            strcpy(local_28,"X");
          }
          else if (local_230 == 1) {
            strcpy(local_28 + 0x47,"Y");
          }
          else if (local_230 == 2) {
            strcpy(local_28 + 0x8e,"Z");
          }
          else if (local_230 == 3) {
            strcpy(local_28 + 0xd5,"T");
          }
        }
        *(undefined4 *)(in_stack_00000028 + (long)local_230 * 4) = 0;
        if (((local_30 == 0) || (*(long *)(local_30 + (long)local_230 * 8) == 0)) ||
           (**(char **)(local_30 + (long)local_230 * 8) == '\0')) {
          iVar2 = ffgcno((fitsfile *)
                         CONCAT17(in_stack_fffffffffffffc77,
                                  CONCAT16(in_stack_fffffffffffffc76,
                                           CONCAT15(in_stack_fffffffffffffc75,
                                                    in_stack_fffffffffffffc70))),
                         (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),in_stack_fffffffffffffc60,
                         in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
          if (0 < iVar2) {
            strcpy(local_1d8,"column for histogram axis doesn\'t exist: ");
            pcVar6 = local_1d8;
            pcVar3 = local_28 + (long)local_230 * 0x47;
            sVar4 = strlen(local_1d8);
            strncat(pcVar6,pcVar3,0x50 - sVar4);
            ffpmsg((char *)0x1e6d0e);
            return (int)*in_stack_00000060;
          }
          ffeqty(in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                 in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc18);
          local_298._52_4_ = 1;
        }
        else {
          lParse_00 = (ParseData *)local_298;
          in_stack_fffffffffffffc18 = (int *)&stack0xfffffffffffffc78;
          in_stack_fffffffffffffc20 = in_stack_00000060;
          iVar2 = ffiprs(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                         in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                         in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                         in_stack_fffffffffffffcd0,
                         (long *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                         in_stack_fffffffffffffce0,in_stack_fffffffffffffce8);
          if (iVar2 != 0) {
            snprintf(local_1d8,0x51,"Parser error of binning expression: %s",
                     *(undefined8 *)(local_30 + (long)local_230 * 8));
            ffpmsg((char *)0x1e6e1a);
            return (int)*in_stack_00000060;
          }
          if ((long)local_298._40_8_ < 0) {
            local_298._40_8_ = (char *)0x1;
          }
          local_298._72_8_ = local_298._40_8_;
          local_298._52_4_ = in_stack_fffffffffffffcd8 + 1;
          ffcprs(lParse_00);
        }
        if ((local_234 < 0) || (local_234 == 0x10)) {
          strcpy(local_1d8,"Inappropriate datatype; can\'t bin this column: ");
          pcVar6 = local_1d8;
          pcVar3 = local_28 + (long)local_230 * 0x47;
          sVar4 = strlen(local_1d8);
          strncat(pcVar6,pcVar3,0x50 - sVar4);
          ffpmsg((char *)0x1e6efc);
          *(int *)in_stack_00000060 = 0x19a;
          return 0x19a;
        }
        if (in_stack_00000058 != (long *)0x0) {
          if (local_230 == 0) {
            *in_stack_00000058 = local_298._72_8_;
          }
          else if ((char *)*in_stack_00000058 != (char *)local_298._72_8_) {
            strcpy(local_1d8,"Vector repeat of input columns do not agree");
            ffpmsg((char *)0x1e6f7a);
            *(int *)in_stack_00000060 = 0x140;
            return 0x140;
          }
        }
        if (in_stack_00000030 != 0) {
          *(int *)(in_stack_00000030 + (long)local_230 * 4) = local_234;
        }
        local_298._64_4_ = 0x5ebab4b7;
        local_298._68_4_ = -0x4757c1d8;
        local_298._56_8_ = (Node *)0xb8a83e285ebab4b7;
        if ((*(char *)(in_stack_00000010 + (long)local_230 * 0x47) != '\0') &&
           (iVar2 = ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                          in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                          (char *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20),
           iVar2 != 0)) {
          ffpmsg((char *)0x1e7061);
          ffpmsg((char *)0x1e707d);
          return (int)*in_stack_00000060;
        }
        dVar5 = *(double *)(local_38 + (long)local_230 * 8);
        if ((dVar5 != -9.1191291391491e-36) || (NAN(dVar5))) {
          *(undefined8 *)(in_stack_00000040 + (long)local_230 * 8) =
               *(undefined8 *)(local_38 + (long)local_230 * 8);
        }
        else if (((local_30 == 0) || (*(long *)(local_30 + (long)local_230 * 8) == 0)) ||
                (**(char **)(local_30 + (long)local_230 * 8) == '\0')) {
          ffkeyn((char *)in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                 in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          iVar2 = ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                        in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                        (char *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
          if (0 < iVar2) {
            *(int *)in_stack_00000060 = 0;
            iVar2 = fits_get_col_minmax(in_stack_00001bc8,in_stack_00001bc4,in_stack_00001bb8,
                                        in_stack_00001bb0,in_stack_00001ba8);
            if (0 < iVar2) {
              strcpy(local_1d8,"Error calculating datamin and datamax for column: ");
              pcVar6 = local_1d8;
              pcVar3 = local_28 + (long)local_230 * 0x47;
              sVar4 = strlen(local_1d8);
              strncat(pcVar6,pcVar3,0x50 - sVar4);
              ffpmsg((char *)0x1e7273);
              return (int)*in_stack_00000060;
            }
          }
        }
        else {
          iVar2 = fits_get_expr_minmax
                            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                             in_stack_fffffffffffffed0,
                             (int *)CONCAT17(cVar7,in_stack_fffffffffffffec8));
          if (0 < iVar2) {
            strcpy(local_1d8,"Error calculating datamin and datamax for expression: ");
            ffpmsg((char *)0x1e7303);
            ffpmsg((char *)0x1e731c);
            return (int)*in_stack_00000060;
          }
          dVar5 = *(double *)(in_stack_00000040 + (long)local_230 * 8);
          if ((dVar5 == -9.1191291391491e-36) && (!NAN(dVar5))) {
            *(undefined8 *)(in_stack_00000040 + (long)local_230 * 8) = 0;
          }
        }
        if ((*(char *)(in_stack_00000018 + (long)local_230 * 0x47) != '\0') &&
           (iVar2 = ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                          in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                          (char *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20),
           iVar2 != 0)) {
          ffpmsg((char *)0x1e73f1);
          ffpmsg((char *)0x1e740d);
          return (int)*in_stack_00000060;
        }
        dVar5 = *(double *)(local_40 + (long)local_230 * 8);
        if ((dVar5 != -9.1191291391491e-36) || (NAN(dVar5))) {
          *(undefined8 *)(in_stack_00000048 + (long)local_230 * 8) =
               *(undefined8 *)(local_40 + (long)local_230 * 8);
        }
        else {
          if (((local_30 == 0) || (*(long *)(local_30 + (long)local_230 * 8) == 0)) ||
             (**(char **)(local_30 + (long)local_230 * 8) == '\0')) {
            ffkeyn((char *)in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20)
                   ,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
            iVar2 = ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                          in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                          (char *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
            if (0 < iVar2) {
              *(int *)in_stack_00000060 = 0;
              if (((double)local_298._56_8_ != -9.1191291391491e-36) ||
                 (NAN((double)local_298._56_8_))) {
                *(undefined8 *)(in_stack_00000048 + (long)local_230 * 8) = local_298._56_8_;
              }
              else {
                iVar2 = fits_get_col_minmax(in_stack_00001bc8,in_stack_00001bc4,in_stack_00001bb8,
                                            in_stack_00001bb0,in_stack_00001ba8);
                if (0 < iVar2) {
                  strcpy(local_1d8,"Error calculating datamin and datamax for column: ");
                  pcVar6 = local_1d8;
                  pcVar3 = local_28 + (long)local_230 * 0x47;
                  sVar4 = strlen(local_1d8);
                  strncat(pcVar6,pcVar3,0x50 - sVar4);
                  ffpmsg((char *)0x1e7641);
                  return (int)*in_stack_00000060;
                }
              }
            }
          }
          else {
            iVar2 = fits_get_expr_minmax
                              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                               in_stack_fffffffffffffed0,
                               (int *)CONCAT17(cVar7,in_stack_fffffffffffffec8));
            if (0 < iVar2) {
              strcpy(local_1d8,"Error calculating datamin and datamax for expression: ");
              ffpmsg((char *)0x1e76de);
              ffpmsg((char *)0x1e76f7);
              return (int)*in_stack_00000060;
            }
            dVar5 = *(double *)(in_stack_00000048 + (long)local_230 * 8);
            if ((dVar5 == -9.1191291391491e-36) && (!NAN(dVar5))) {
              *(undefined8 *)(in_stack_00000040 + (long)local_230 * 8) = 0x3ff0000000000000;
            }
          }
          local_244 = 1;
        }
        if ((*(char *)(in_stack_00000020 + (long)local_230 * 0x47) != '\0') &&
           (iVar2 = ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                          in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                          (char *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20),
           iVar2 != 0)) {
          ffpmsg((char *)0x1e77da);
          ffpmsg((char *)0x1e77f6);
          return (int)*in_stack_00000060;
        }
        dVar5 = *(double *)(in_stack_00000008 + (long)local_230 * 8);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          ffpmsg((char *)0x1e783a);
          *(int *)in_stack_00000060 = 0x142;
          return 0x142;
        }
        dVar5 = *(double *)(in_stack_00000008 + (long)local_230 * 8);
        if ((dVar5 != -9.1191291391491e-36) || (NAN(dVar5))) {
          *(undefined8 *)(in_stack_00000050 + (long)local_230 * 8) =
               *(undefined8 *)(in_stack_00000008 + (long)local_230 * 8);
        }
        else {
          local_22c = 0;
          if (((local_30 == 0) || (*(long *)(local_30 + (long)local_230 * 8) == 0)) ||
             (**(char **)(local_30 + (long)local_230 * 8) == '\0')) {
            ffkeyn((char *)in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20)
                   ,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
            ffgky(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                  in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                  (char *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
          }
          if (((local_22c != 0) ||
              (((local_30 != 0 && (*(long *)(local_30 + (long)local_230 * 8) != 0)) &&
               (**(char **)(local_30 + (long)local_230 * 8) != '\0')))) &&
             (*(double *)(in_stack_00000050 + (long)local_230 * 8) =
                   (*(double *)(in_stack_00000048 + (long)local_230 * 8) -
                   *(double *)(in_stack_00000040 + (long)local_230 * 8)) / 10.0,
             1.0 < *(double *)(in_stack_00000050 + (long)local_230 * 8))) {
            *(undefined8 *)(in_stack_00000050 + (long)local_230 * 8) = 0x3ff0000000000000;
          }
        }
        dVar5 = *(double *)(in_stack_00000040 + (long)local_230 * 8);
        pdVar1 = (double *)(in_stack_00000048 + (long)local_230 * 8);
        if (((*pdVar1 <= dVar5 && dVar5 != *pdVar1) &&
            (0.0 < *(double *)(in_stack_00000050 + (long)local_230 * 8))) ||
           ((*(double *)(in_stack_00000040 + (long)local_230 * 8) <
             *(double *)(in_stack_00000048 + (long)local_230 * 8) &&
            (pdVar1 = (double *)(in_stack_00000050 + (long)local_230 * 8),
            *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) {
          *(ulong *)(in_stack_00000050 + (long)local_230 * 8) =
               *(ulong *)(in_stack_00000050 + (long)local_230 * 8) ^ 0x8000000000000000;
        }
        local_240 = (int)*(double *)(in_stack_00000050 + (long)local_230 * 8);
        local_238 = (int)*(double *)(in_stack_00000040 + (long)local_230 * 8);
        local_23c = (int)*(double *)(in_stack_00000048 + (long)local_230 * 8);
        if (((((0x29 < local_234) ||
              (pdVar1 = (double *)(in_stack_00000040 + (long)local_230 * 8),
              (double)local_238 != *pdVar1)) || (NAN((double)local_238) || NAN(*pdVar1))) ||
            ((pdVar1 = (double *)(in_stack_00000048 + (long)local_230 * 8),
             (double)local_23c != *pdVar1 || (NAN((double)local_23c) || NAN(*pdVar1))))) ||
           ((pdVar1 = (double *)(in_stack_00000050 + (long)local_230 * 8),
            (double)local_240 != *pdVar1 || (NAN((double)local_240) || NAN(*pdVar1))))) {
          if (local_244 == 0) {
            *(long *)(in_stack_00000038 + (long)local_230 * 8) =
                 (long)((*(double *)(in_stack_00000048 + (long)local_230 * 8) -
                        *(double *)(in_stack_00000040 + (long)local_230 * 8)) /
                       *(double *)(in_stack_00000050 + (long)local_230 * 8));
            if (*(double *)(in_stack_00000048 + (long)local_230 * 8) <=
                *(double *)(in_stack_00000040 + (long)local_230 * 8)) {
              dVar5 = (double)*(long *)(in_stack_00000038 + (long)local_230 * 8) *
                      *(double *)(in_stack_00000050 + (long)local_230 * 8) +
                      *(double *)(in_stack_00000040 + (long)local_230 * 8);
              pdVar1 = (double *)(in_stack_00000048 + (long)local_230 * 8);
              if (*pdVar1 <= dVar5 && dVar5 != *pdVar1) {
                *(long *)(in_stack_00000038 + (long)local_230 * 8) =
                     *(long *)(in_stack_00000038 + (long)local_230 * 8) + 1;
              }
            }
            else if ((double)*(long *)(in_stack_00000038 + (long)local_230 * 8) *
                     *(double *)(in_stack_00000050 + (long)local_230 * 8) +
                     *(double *)(in_stack_00000040 + (long)local_230 * 8) <
                     *(double *)(in_stack_00000048 + (long)local_230 * 8)) {
              *(long *)(in_stack_00000038 + (long)local_230 * 8) =
                   *(long *)(in_stack_00000038 + (long)local_230 * 8) + 1;
            }
          }
          else {
            *(long *)(in_stack_00000038 + (long)local_230 * 8) =
                 (long)((*(double *)(in_stack_00000048 + (long)local_230 * 8) -
                        *(double *)(in_stack_00000040 + (long)local_230 * 8)) /
                        *(double *)(in_stack_00000050 + (long)local_230 * 8) + 1.0);
          }
        }
        else {
          *(long *)(in_stack_00000038 + (long)local_230 * 8) =
               (long)((local_23c - local_238) / local_240 + 1);
          if (*(double *)(in_stack_00000048 + (long)local_230 * 8) <=
              *(double *)(in_stack_00000040 + (long)local_230 * 8)) {
            *(double *)(in_stack_00000040 + (long)local_230 * 8) =
                 *(double *)(in_stack_00000040 + (long)local_230 * 8) + 0.5;
            *(double *)(in_stack_00000048 + (long)local_230 * 8) =
                 *(double *)(in_stack_00000048 + (long)local_230 * 8) - 0.5;
          }
          else {
            *(double *)(in_stack_00000040 + (long)local_230 * 8) =
                 *(double *)(in_stack_00000040 + (long)local_230 * 8) - 0.5;
            *(double *)(in_stack_00000048 + (long)local_230 * 8) =
                 *(double *)(in_stack_00000048 + (long)local_230 * 8) + 0.5;
          }
        }
      }
      local_c = (int)*in_stack_00000060;
    }
    else {
      ffpmsg((char *)0x1e6715);
      *(int *)in_stack_00000060 = 0x140;
      local_c = 0x140;
    }
  }
  else {
    local_c = (int)*in_stack_00000060;
  }
  return local_c;
}

Assistant:

int fits_calc_binningde(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      char *colexpr[4],  /* I - optional column expression instead of name*/
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      int *datatypes,  /* O - datatypes of each output column */
      long *haxes,     /* O - number of bins in each histogram axis */
      double *amin,     /* O - lower bound of the histogram axes */
      double *amax,     /* O - upper bound of the histogram axes */
      double *binsize,  /* O - width of histogram bins/pixels on each axis */
      long *repeat,     /* O - vector repeat of input columns */
      int *status)
/*_
    Calculate the actual binning parameters, based on various user input
    options.

    Note: caller is responsible to free parsers[*] upon return using ffcprs()
*/
{
    tcolumn *colptr;
    char *cptr, cpref[4][FLEN_VALUE];
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD];
    int tstatus, ii;
    int datatype, imin, imax, ibin,  use_datamax = 0;
    long repeat1;
    double datamin, datamax;
    int ncols;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Initialize the number of iterator columns required */
    if (repeat)    (*repeat) = 0;

    if (naxis > 4)
    {
        ffpmsg("histograms with more than 4 dimensions are not supported");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);
    
    /* ============================================================= */
    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    *cpref[0] = '\0';
    *cpref[1] = '\0';
    *cpref[2] = '\0';
    *cpref[3] = '\0';

    tstatus = 0;
    ffgky(fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    /* ============================================================= */
    /* Main Loop for calculating parameters for each column          */

    for (ii = 0; ii < naxis; ii++)
    {

      /* =========================================================== */
      /* Determine column Number, based on, in order of priority,
         1  input column name, or
	 2  name given by CPREF keyword, or
	 3  assume X, Y, Z and T for the name
      */

      if (*colname[ii] == '\0' && 
	  (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0'))
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      colnum[ii] = 0;
      if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
	if (ffgcno(fptr, CASEINSEN, colname[ii], colnum+ii, status) > 0)
	  {
	    strcpy(errmsg, "column for histogram axis doesn't exist: ");
	    strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	    ffpmsg(errmsg);
	    return(*status);
	  }
	
	/* ================================================================ */
	/* check tha column is not a vector or a string                     */
	
	/* get the datatype of the column */
	fits_get_eqcoltype(fptr, colnum[ii], &datatype,
			   &repeat1, NULL, status);
	
	ncols = 1; /* Require only one iterator column, the actual column */

      } else { /* column expression: use parse to determine datatype and dimensions */

	long nelem, naxes[MAXDIMS];
	int naxis;
	ParseData lParse;

	/* Initialize the parser so that we can determine the datatype
	   of the returned type as well as the vector dimensions */
	if ( ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis,
		     naxes, &lParse, status ) ) {
	  snprintf(errmsg, FLEN_ERRMSG, 
		   "Parser error of binning expression: %s", 
		   colexpr[ii]);
	  ffpmsg(errmsg);
	  return *status;
	}
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	repeat1 = nelem;

	/* We require lParse.nCols columns to be read from input,
	   plus one for the Temporary calculator result */
	ncols = lParse.nCols + 1;
	ffcprs( &lParse );
      }

      /* Not sure why this repeat limitation is here -- CM
	 The iterator system can handle vector columns just fine
`       */
      if (datatype < 0 || datatype == TSTRING)
      {
	strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
	strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	ffpmsg(errmsg);
	return(*status = BAD_DATATYPE);
      }

      /* Store repeat value for future use */
      if (repeat) {
	if (ii == 0) {
	  *repeat = repeat1; /* First time around save the repeat value */

	} else if (*repeat != repeat1) { /* later dimensions, keep same dims */

	  strcpy(errmsg, "Vector repeat of input columns do not agree");
	  ffpmsg(errmsg);
	  return (*status = BAD_DIMEN);
	}
      }

      if (datatypes) datatypes[ii] = datatype;

      /* ================================================================ */
      /* get the minimum value */

      datamin = DOUBLENULLVALUE;
      datamax = DOUBLENULLVALUE;
      
      if (*minname[ii])
      {
         if (ffgky(fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (minin[ii] != DOUBLENULLVALUE)
      {
        amin[ii] = (double) minin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMIN", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(fptr, colnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      } else { /* it's an expression */
	if (fits_get_expr_minmax(fptr, colexpr[ii], amin+ii, &datamax, 0, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
                ffpmsg(errmsg);
		ffpmsg(colexpr[ii]);
                return(*status);
            }
	if (amin[ii] == DOUBLENULLVALUE) amin[ii] = 0.0;
	
      }

      /* ================================================================ */
      /* get the maximum value */

      if (*maxname[ii])
      {
         if (ffgky(fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (maxin[ii] != DOUBLENULLVALUE)
      {
        amax[ii] = (double) maxin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMAX", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(fptr, colnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */

      } else { /* it's an expression */

	if (fits_get_expr_minmax(fptr, colexpr[ii], &datamin, &amax[ii], 0, status) > 0)
	{
	  strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
	  ffpmsg(errmsg);
	  ffpmsg(colexpr[ii]);
	  return(*status);
	}
	if (amax[ii] == DOUBLENULLVALUE) amin[ii] = 1.0;
        use_datamax = 1;  
      }


      /* ================================================================ */
      /* determine binning size and range                                 */

      if (*binname[ii])
      {
         if (ffgky(fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] != DOUBLENULLVALUE)
      { 
         binsize[ii] = (double) binsizein[ii];
      }
      else
      {
         tstatus = 0;

	 if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
	 {
	   ffkeyn("TDBIN", colnum[ii], keyname, &tstatus);
	   ffgky(fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus);
	 }

         if (tstatus || 
	     colexpr && colexpr[ii] && colexpr[ii][0]) {
	    /* make at least 10 bins */
            binsize[ii] = (amax[ii] - amin[ii]) / 10.F ;
            if (binsize[ii] > 1.)
                binsize[ii] = 1.;  /* use default bin size */
         }
      }

      /* ================================================================ */
      /* if the min is greater than the max, make the binsize negative */
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          binsize[ii] =  -binsize[ii];  /* reverse the sign of binsize */


      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
                               (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        haxes[ii] = (long) (((amax[ii] - amin[ii]) / binsize[ii]) + 1.); 
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        haxes[ii] = (long) ((amax[ii] - amin[ii]) / binsize[ii]);

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

    return(*status);
}